

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cpp
# Opt level: O3

void __thiscall
icu_63::CheckedArrayByteSink::Append(CheckedArrayByteSink *this,char *bytes,int32_t n)

{
  int iVar1;
  uint uVar2;
  
  if (0 < n) {
    if ((this->appended_ ^ 0x7fffffffU) < (uint)n) {
      this->appended_ = 0x7fffffff;
      this->overflowed_ = '\x01';
    }
    else {
      this->appended_ = this->appended_ + n;
      iVar1 = this->size_;
      uVar2 = this->capacity_ - iVar1;
      if (((n <= (int)uVar2) || (this->overflowed_ = '\x01', n = uVar2, 0 < (int)uVar2)) &&
         (uVar2 = n, this->outbuf_ + iVar1 != bytes)) {
        memcpy(this->outbuf_ + iVar1,bytes,(ulong)(uint)n);
        iVar1 = this->size_;
      }
      this->size_ = iVar1 + uVar2;
    }
  }
  return;
}

Assistant:

void CheckedArrayByteSink::Append(const char* bytes, int32_t n) {
  if (n <= 0) {
    return;
  }
  if (n > (INT32_MAX - appended_)) {
    // TODO: Report as integer overflow, not merely buffer overflow.
    appended_ = INT32_MAX;
    overflowed_ = TRUE;
    return;
  }
  appended_ += n;
  int32_t available = capacity_ - size_;
  if (n > available) {
    n = available;
    overflowed_ = TRUE;
  }
  if (n > 0 && bytes != (outbuf_ + size_)) {
    uprv_memcpy(outbuf_ + size_, bytes, n);
  }
  size_ += n;
}